

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O2

ComparatorDisposer *
ApprovalTests::ComparatorFactory::registerComparator
          (ComparatorDisposer *__return_storage_ptr__,string *extensionWithDot,
          shared_ptr<ApprovalTests::ApprovalComparator> *comparator)

{
  __shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  ComparatorFactory local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  comparators_abi_cxx11_();
  getComparatorForFileExtensionWithDot(local_38,extensionWithDot);
  ::std::__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &comparator->
              super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>);
  ComparatorDisposer::ComparatorDisposer
            (__return_storage_ptr__,&comparators[abi:cxx11]()::allComparators_abi_cxx11_,
             extensionWithDot,(shared_ptr<ApprovalTests::ApprovalComparator> *)local_38,
             (shared_ptr<ApprovalTests::ApprovalComparator> *)&_Stack_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ComparatorDisposer
    ComparatorFactory::registerComparator(const std::string& extensionWithDot,
                                          std::shared_ptr<ApprovalComparator> comparator)
    {
        return ComparatorDisposer(comparators(),
                                  extensionWithDot,
                                  getComparatorForFileExtensionWithDot(extensionWithDot),
                                  comparator);
    }